

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_cte.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalMaterializedCTE *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  idx_t *__k;
  ClientContext *args_1;
  reference pvVar1;
  mapped_type *this_01;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  *pvVar2;
  type pLVar3;
  PhysicalOperator *pPVar4;
  PhysicalOperator *args_4;
  PhysicalCTE *pPVar5;
  shared_ptr<duckdb::ColumnDataCollection,_true> working_table;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined8 local_38;
  
  args_1 = this->context;
  this_00 = &(op->super_LogicalOperator).children;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  operator->(pvVar1);
  make_shared_ptr<duckdb::ColumnDataCollection,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            ((ClientContext *)&working_table,(vector<duckdb::LogicalType,_true> *)args_1);
  __k = &op->table_index;
  this_01 = ::std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->recursive_cte_tables,__k);
  shared_ptr<duckdb::ColumnDataCollection,_true>::operator=(this_01,&working_table);
  local_48 = (element_type *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._0_1_ = (__atomic_base<bool>)0x0;
  local_38._1_7_ = 0;
  pvVar2 = &::std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->materialized_ctes,__k)->
            super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ;
  ::std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::_M_move_assign(pvVar2);
  std::
  _Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                   *)&local_48);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar1);
  pPVar4 = CreatePlan(this,pLVar3);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar1);
  args_4 = CreatePlan(this,pLVar3);
  pPVar4 = Make<duckdb::PhysicalCTE,std::__cxx11::string&,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,unsigned_long&>
                     (this,&op->ctename,__k,&args_4->types,pPVar4,args_4,
                      &(op->super_LogicalOperator).estimated_cardinality);
  pPVar5 = PhysicalOperator::Cast<duckdb::PhysicalCTE>(pPVar4);
  shared_ptr<duckdb::ColumnDataCollection,_true>::operator=(&pPVar5->working_table,&working_table);
  pvVar2 = &::std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->materialized_ctes,__k)->
            super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ;
  ::std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::operator=(&(pPVar5->cte_scans).
               super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
              ,pvVar2);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&working_table.internal.
              super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return pPVar4;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalMaterializedCTE &op) {
	D_ASSERT(op.children.size() == 2);

	// Create the working_table that the PhysicalCTE will use for evaluation.
	auto working_table = make_shared_ptr<ColumnDataCollection>(context, op.children[0]->types);

	// Add the ColumnDataCollection to the context of this PhysicalPlanGenerator
	recursive_cte_tables[op.table_index] = working_table;
	materialized_ctes[op.table_index] = vector<const_reference<PhysicalOperator>>();

	// Create the plan for the left side. This is the materialization.
	auto &left = CreatePlan(*op.children[0]);
	// Initialize an empty vector to collect the scan operators.
	auto &right = CreatePlan(*op.children[1]);

	auto &cte = Make<PhysicalCTE>(op.ctename, op.table_index, right.types, left, right, op.estimated_cardinality);
	auto &cast_cte = cte.Cast<PhysicalCTE>();
	cast_cte.working_table = working_table;
	cast_cte.cte_scans = materialized_ctes[op.table_index];
	return cte;
}